

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifyObjLimitReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  ostream *poVar2;
  Real RVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  cpp_dec_float<100U,_int,_void> local_208;
  cpp_dec_float<100U,_int,_void> local_1b8;
  cpp_dec_float<100U,_int,_void> local_168;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  cpp_dec_float<100U,_int,_void> local_78;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," --- verifying objective limit",0x1e);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_78,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_1b8,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_208,0,(type *)0x0);
  bVar5 = getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_1b8,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_78);
  bVar6 = getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&local_208,
                              (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_78);
  if ((bVar5) && (bVar6)) {
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!NAN(RVar3)) && (local_1b8.fpclass != cpp_dec_float_NaN)) {
      local_168.fpclass = cpp_dec_float_finite;
      local_168.prec_elem = 0x10;
      local_168.data._M_elems[0] = 0;
      local_168.data._M_elems[1] = 0;
      local_168.data._M_elems[2] = 0;
      local_168.data._M_elems[3] = 0;
      local_168.data._M_elems[4] = 0;
      local_168.data._M_elems[5] = 0;
      local_168.data._M_elems[6] = 0;
      local_168.data._M_elems[7] = 0;
      local_168.data._M_elems[8] = 0;
      local_168.data._M_elems[9] = 0;
      local_168.data._M_elems[10] = 0;
      local_168.data._M_elems[0xb] = 0;
      local_168.data._M_elems[0xc] = 0;
      local_168.data._M_elems[0xd] = 0;
      local_168.data._M_elems._56_5_ = 0;
      local_168.data._M_elems[0xf]._1_3_ = 0;
      local_168.exp = 0;
      local_168.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_168,RVar3);
      iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_1b8,&local_168);
      if (-1 < iVar7) goto LAB_004a5199;
    }
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (NAN(RVar3)) {
      return;
    }
    if (local_208.fpclass == cpp_dec_float_NaN) {
      return;
    }
    local_168.fpclass = cpp_dec_float_finite;
    local_168.prec_elem = 0x10;
    local_168.data._M_elems[0] = 0;
    local_168.data._M_elems[1] = 0;
    local_168.data._M_elems[2] = 0;
    local_168.data._M_elems[3] = 0;
    local_168.data._M_elems[4] = 0;
    local_168.data._M_elems[5] = 0;
    local_168.data._M_elems[6] = 0;
    local_168.data._M_elems[7] = 0;
    local_168.data._M_elems[8] = 0;
    local_168.data._M_elems[9] = 0;
    local_168.data._M_elems[10] = 0;
    local_168.data._M_elems[0xb] = 0;
    local_168.data._M_elems[0xc] = 0;
    local_168.data._M_elems[0xd] = 0;
    local_168.data._M_elems._56_5_ = 0;
    local_168.data._M_elems[0xf]._1_3_ = 0;
    local_168.exp = 0;
    local_168.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_168,RVar3);
    iVar7 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_208,&local_168);
    if (iVar7 < 0) {
      return;
    }
  }
LAB_004a5199:
  VVar1 = (this->spxout).m_verbosity;
  if (4 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[5],", dual violation: ",0x12);
    local_c8.m_backend.data._M_elems[0] = local_1b8.data._M_elems[0];
    local_c8.m_backend.data._M_elems[1] = local_1b8.data._M_elems[1];
    local_c8.m_backend.data._M_elems[2] = local_1b8.data._M_elems[2];
    local_c8.m_backend.data._M_elems[3] = local_1b8.data._M_elems[3];
    local_c8.m_backend.data._M_elems[4] = local_1b8.data._M_elems[4];
    local_c8.m_backend.data._M_elems[5] = local_1b8.data._M_elems[5];
    local_c8.m_backend.data._M_elems[6] = local_1b8.data._M_elems[6];
    local_c8.m_backend.data._M_elems[7] = local_1b8.data._M_elems[7];
    local_c8.m_backend.data._M_elems[8] = local_1b8.data._M_elems[8];
    local_c8.m_backend.data._M_elems[9] = local_1b8.data._M_elems[9];
    local_c8.m_backend.data._M_elems[10] = local_1b8.data._M_elems[10];
    local_c8.m_backend.data._M_elems[0xb] = local_1b8.data._M_elems[0xb];
    local_c8.m_backend.data._M_elems[0xc] = local_1b8.data._M_elems[0xc];
    local_c8.m_backend.data._M_elems[0xd] = local_1b8.data._M_elems[0xd];
    local_c8.m_backend.data._M_elems[0xe] = local_1b8.data._M_elems[0xe];
    local_c8.m_backend.data._M_elems[0xf] = local_1b8.data._M_elems[0xf];
    local_c8.m_backend.exp = local_1b8.exp;
    local_c8.m_backend.neg = local_1b8.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", redcost violation: ",0x15);
    local_118.m_backend.data._M_elems[0] = local_208.data._M_elems[0];
    local_118.m_backend.data._M_elems[1] = local_208.data._M_elems[1];
    local_118.m_backend.data._M_elems[2] = local_208.data._M_elems[2];
    local_118.m_backend.data._M_elems[3] = local_208.data._M_elems[3];
    local_118.m_backend.data._M_elems[4] = local_208.data._M_elems[4];
    local_118.m_backend.data._M_elems[5] = local_208.data._M_elems[5];
    local_118.m_backend.data._M_elems[6] = local_208.data._M_elems[6];
    local_118.m_backend.data._M_elems[7] = local_208.data._M_elems[7];
    local_118.m_backend.data._M_elems[8] = local_208.data._M_elems[8];
    local_118.m_backend.data._M_elems[9] = local_208.data._M_elems[9];
    local_118.m_backend.data._M_elems[10] = local_208.data._M_elems[10];
    local_118.m_backend.data._M_elems[0xb] = local_208.data._M_elems[0xb];
    local_118.m_backend.data._M_elems[0xc] = local_208.data._M_elems[0xc];
    local_118.m_backend.data._M_elems[0xd] = local_208.data._M_elems[0xd];
    local_118.m_backend.data._M_elems[0xe] = local_208.data._M_elems[0xe];
    local_118.m_backend.data._M_elems[0xf] = local_208.data._M_elems[0xf];
    local_118.m_backend.exp = local_208.exp;
    local_118.m_backend.neg = local_208.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_118);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3],
               " --- detected violations in original problem space -- solve again without presolving/scaling"
               ,0x5c);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  if (this->_simplifier ==
      (SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       *)0x0 && this->_scaler ==
                (SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x0) {
    (this->_solver).useTerminationValue = false;
  }
  else if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifyObjLimitReal()
{
   SPX_MSG_INFO1(spxout, spxout << " --- verifying objective limit" << std::endl;)

   R sumviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   bool dualfeasible = true;

   if(!getDualViolation(dualviol, sumviol))
      dualfeasible = false;

   if(!getRedCostViolation(redcostviol, sumviol))
      dualfeasible = false;

   if(!dualfeasible || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      // if we already disabled simplifier and scaler, next disable the objective limit
      if(_scaler == nullptr && _simplifier == nullptr)
      {
         _solver.toggleTerminationValue(false);
      }
      else if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}